

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

char * jsgf_fullname(jsgf_t *jsgf,char *name)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  pcVar1 = strchr(name + 1,0x2e);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = __ckd_salloc__(name,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0xe2);
    return pcVar1;
  }
  sVar2 = strlen(jsgf->name);
  sVar3 = strlen(name);
  pcVar1 = (char *)__ckd_malloc__(sVar2 + sVar3 + 4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                                  ,0xe5);
  sprintf(pcVar1,"<%s.%s",jsgf->name,name + 1);
  return pcVar1;
}

Assistant:

static char *
jsgf_fullname(jsgf_t * jsgf, const char *name)
{
    char *fullname;

    /* Check if it is already qualified */
    if (strchr(name + 1, '.'))
        return ckd_salloc(name);

    /* Skip leading < in name */
    fullname = ckd_malloc(strlen(jsgf->name) + strlen(name) + 4);
    sprintf(fullname, "<%s.%s", jsgf->name, name + 1);
    return fullname;
}